

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find_or_prepare_insert<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t hash)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  bool bVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  pair<unsigned_long,_bool> pVar14;
  __m128i match;
  long local_a8;
  size_t local_a0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_int_&>_>
  local_78;
  undefined1 local_68 [16];
  size_t local_50;
  undefined1 local_48 [16];
  
  uVar2 = *(ulong *)(this + 0x18);
  uVar8 = hash >> 7 & uVar2;
  local_48 = vpbroadcastb_avx512vl();
  local_a8 = 0;
  local_50 = hash;
  do {
    uVar10 = vpcmpeqb_avx512vl(*(undefined1 (*) [16])(*(long *)this + uVar8),local_48);
    bVar12 = (short)uVar10 == 0;
    auVar13 = *(undefined1 (*) [16])(*(long *)this + uVar8);
    auVar3 = local_68;
    while (local_68 = auVar13, iVar11 = 4, auVar13 = local_68, !bVar12) {
      uVar4 = 0;
      uVar9 = (uint)uVar10;
      for (uVar5 = uVar9; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
        uVar4 = uVar4 + 1;
      }
      uVar10 = uVar4 + uVar8 & uVar2;
      local_78.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 8) + uVar10 * 0x28);
      local_78.second.super__Tuple_impl<0UL,_const_int_&>.super__Head_base<0UL,_const_int_&,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_const_int_&>)(*(long *)(this + 8) + 0x20 + uVar10 * 0x28);
      local_88.rhs = key;
      local_88.eq = (key_equal *)(this + 0x28);
      bVar6 = memory_internal::
              DecomposePairImpl<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<int_const&>>
                        (&local_88,&local_78);
      auVar3 = local_68;
      if (bVar6) {
        iVar11 = 1;
        auVar13 = local_68;
        local_a0 = uVar10;
        break;
      }
      uVar9 = uVar9 - 1 & uVar9;
      uVar10 = (ulong)uVar9;
      auVar13 = local_68;
      bVar12 = uVar9 == 0;
    }
    local_68 = auVar3;
    if (bVar12) {
      auVar3 = vpsignb_avx(auVar13,auVar13);
      iVar11 = 3;
      if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]) {
        lVar1 = local_a8 + 0x10;
        local_a8 = local_a8 + 0x10;
        uVar8 = lVar1 + uVar8 & uVar2;
        iVar11 = 0;
      }
    }
    if (iVar11 != 0) {
      if (iVar11 == 3) {
        local_a0 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::prepare_insert((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)this,local_50);
        uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      else {
        uVar7 = 0;
      }
      pVar14._8_8_ = uVar7;
      pVar14.first = local_a0;
      return pVar14;
    }
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return {seq.offset(i), false};
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return {prepare_insert(hash), true};
    }